

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O1

int EVP_PKEY_sign_init(EVP_PKEY_CTX *ctx)

{
  long lVar1;
  int iVar2;
  
  if (((ctx == (EVP_PKEY_CTX *)0x0) || (lVar1 = *(long *)ctx, lVar1 == 0)) ||
     ((*(long *)(lVar1 + 0x28) == 0 && (*(long *)(lVar1 + 0x30) == 0)))) {
    iVar2 = 0;
    ERR_put_error(6,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0xac);
  }
  else {
    *(undefined4 *)(ctx + 0x20) = 8;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int EVP_PKEY_sign_init(EVP_PKEY_CTX *ctx) {
  if (ctx == NULL || ctx->pmeth == NULL ||
      (ctx->pmeth->sign == NULL && ctx->pmeth->sign_message == NULL)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }

  ctx->operation = EVP_PKEY_OP_SIGN;
  return 1;
}